

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

void __thiscall higan::Socket::Socket(Socket *this,int fd,InetAddress *address)

{
  pointer pcVar1;
  
  this->fd_ = fd;
  (this->address_).ip_._M_dataplus._M_p = (pointer)&(this->address_).ip_.field_2;
  pcVar1 = (address->ip_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->address_,pcVar1,pcVar1 + (address->ip_)._M_string_length);
  (this->address_).port_ = address->port_;
  SetKeepALive(this);
  return;
}

Assistant:

Socket::Socket(int fd, const InetAddress& address):
		fd_(fd),
		address_(address)
{
	SetKeepALive();
}